

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

mem_expr_t add_mem_insn(gen_ctx_t gen_ctx,MIR_insn_t mem_insn)

{
  int iVar1;
  mem_expr_t in_RAX;
  mem_expr_t el;
  undefined4 extraout_var;
  mem_expr_t tab_e;
  
  if (((*(uint *)&mem_insn->field_0x18 & 0xfffffffc) == 0) &&
     ((mem_insn->ops[0].field_0x8 == '\v' || (*(char *)&mem_insn[1].insn_link.prev == '\v')))) {
    tab_e = in_RAX;
    el = VARR_mem_expr_tget(gen_ctx->gvn_ctx->mem_exprs,
                            (ulong)*(uint *)((long)mem_insn->data + 0x10));
    el->next = (mem_expr *)0x0;
    iVar1 = HTAB_mem_expr_t_do(gen_ctx->gvn_ctx->mem_expr_tab,el,HTAB_FIND,&tab_e);
    if (iVar1 != 0) {
      el->next = tab_e;
    }
    iVar1 = HTAB_mem_expr_t_do(gen_ctx->gvn_ctx->mem_expr_tab,el,HTAB_REPLACE,&tab_e);
    return (mem_expr_t)CONCAT44(extraout_var,iVar1);
  }
  __assert_fail("move_code_p (mem_insn->code) && (mem_insn->ops[0].mode == MIR_OP_VAR_MEM || mem_insn->ops[1].mode == MIR_OP_VAR_MEM)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0xe9c,"mem_expr_t add_mem_insn(gen_ctx_t, MIR_insn_t)");
}

Assistant:

static mem_expr_t add_mem_insn (gen_ctx_t gen_ctx, MIR_insn_t mem_insn) {
  bb_insn_t bb_insn = mem_insn->data;
  mem_expr_t tab_e, e;

  gen_assert (
    move_code_p (mem_insn->code)
    && (mem_insn->ops[0].mode == MIR_OP_VAR_MEM || mem_insn->ops[1].mode == MIR_OP_VAR_MEM));
  e = VARR_GET (mem_expr_t, mem_exprs, bb_insn->mem_index);
  e->next = NULL;
  if (HTAB_DO (mem_expr_t, mem_expr_tab, e, HTAB_FIND, tab_e)) e->next = tab_e;
  HTAB_DO (mem_expr_t, mem_expr_tab, e, HTAB_REPLACE, tab_e);
  return e;
}